

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextGLImpl.cpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextGLImpl::MapTextureSubresource
          (DeviceContextGLImpl *this,ITexture *pTexture,Uint32 MipLevel,Uint32 ArraySlice,
          MAP_TYPE MapType,MAP_FLAGS MapFlags,Box *pMapRegion,MappedTextureSubresource *MappedData)

{
  TextureBaseGL *pTVar1;
  TextureDesc *TexDesc;
  Uint64 Offset;
  BufferGLImpl *this_00;
  MipLevelProperties MipLevelAttribs;
  
  DeviceContextBase<Diligent::EngineGLImplTraits>::MapTextureSubresource
            (&this->super_DeviceContextBase<Diligent::EngineGLImplTraits>,pTexture,MipLevel,
             ArraySlice,MapType,MapFlags,pMapRegion,MappedData);
  pTVar1 = ClassPtrCast<Diligent::TextureBaseGL,Diligent::ITexture>(pTexture);
  TexDesc = (TextureDesc *)
            (**(code **)((long)(pTVar1->super_TextureBase<Diligent::EngineGLImplTraits>).
                               super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                               .super_ObjectBase<Diligent::ITextureGL>.
                               super_RefCountedObject<Diligent::ITextureGL>.super_ITextureGL.
                               super_ITexture.super_IDeviceObject + 0x20))(pTVar1);
  if (TexDesc->Usage == USAGE_STAGING) {
    Offset = GetStagingTextureSubresourceOffset(TexDesc,ArraySlice,MipLevel,4);
    GetMipLevelProperties(&MipLevelAttribs,TexDesc,MipLevel);
    this_00 = ClassPtrCast<Diligent::BufferGLImpl,Diligent::IBuffer>((pTVar1->m_pPBO).m_pObject);
    BufferGLImpl::MapRange
              (this_00,&this->m_ContextState,MapType,(uint)MapFlags,Offset,MipLevelAttribs.MipSize,
               &MappedData->pData);
    MappedData->Stride = MipLevelAttribs.RowSize;
    MappedData->DepthStride = MipLevelAttribs.MipSize;
  }
  else {
    FormatString<char[46]>
              ((string *)&MipLevelAttribs,
               (char (*) [46])"Only staging textures can be mapped in OpenGL");
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(2,MipLevelAttribs._0_8_,0,0,0);
    }
    std::__cxx11::string::~string((string *)&MipLevelAttribs);
    MappedData->pData = (PVoid)0x0;
    MappedData->Stride = 0;
    MappedData->DepthStride = 0;
  }
  return;
}

Assistant:

void DeviceContextGLImpl::MapTextureSubresource(ITexture*                 pTexture,
                                                Uint32                    MipLevel,
                                                Uint32                    ArraySlice,
                                                MAP_TYPE                  MapType,
                                                MAP_FLAGS                 MapFlags,
                                                const Box*                pMapRegion,
                                                MappedTextureSubresource& MappedData)
{
    TDeviceContextBase::MapTextureSubresource(pTexture, MipLevel, ArraySlice, MapType, MapFlags, pMapRegion, MappedData);
    TextureBaseGL*     pTexGL  = ClassPtrCast<TextureBaseGL>(pTexture);
    const TextureDesc& TexDesc = pTexGL->GetDesc();
    if (TexDesc.Usage == USAGE_STAGING)
    {
        Uint64             PBOOffset       = GetStagingTextureSubresourceOffset(TexDesc, ArraySlice, MipLevel, TextureBaseGL::PBOOffsetAlignment);
        MipLevelProperties MipLevelAttribs = GetMipLevelProperties(TexDesc, MipLevel);
        BufferGLImpl*      pPBO            = ClassPtrCast<BufferGLImpl>(pTexGL->GetPBO());
        pPBO->MapRange(m_ContextState, MapType, MapFlags, PBOOffset, MipLevelAttribs.MipSize, MappedData.pData);

        MappedData.Stride      = MipLevelAttribs.RowSize;
        MappedData.DepthStride = MipLevelAttribs.MipSize;
    }
    else
    {
        LOG_ERROR_MESSAGE("Only staging textures can be mapped in OpenGL");
        MappedData = MappedTextureSubresource{};
    }
}